

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O3

void __thiscall duckdb::DbpEncoder::WriteBlock(DbpEncoder *this,WriteStream *writer)

{
  data_t *__s;
  byte bVar1;
  bool bVar2;
  int64_t *piVar3;
  long lVar4;
  ulong uVar5;
  bitpacking_width_t *pbVar6;
  ulong uVar7;
  long lVar8;
  int64_t iVar9;
  bitpacking_width_t bVar10;
  unsigned_long value;
  ulong uVar11;
  ulong uVar12;
  byte local_61;
  int64_t *local_60;
  DbpEncoder *local_58;
  bitpacking_width_t *local_50;
  ulong local_48;
  WriteStream *local_40;
  ulong local_38;
  
  uVar12 = this->block_count + 0xff;
  uVar7 = uVar12 >> 8;
  if (0xff < uVar12) {
    piVar3 = this->data;
    lVar4 = 0;
    uVar5 = 0;
    do {
      lVar8 = 0;
      do {
        if ((ulong)(lVar4 + lVar8) < this->block_count) {
          iVar9 = piVar3[lVar8] - this->min_delta;
        }
        else {
          iVar9 = 0;
        }
        piVar3[lVar8] = iVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x100);
      uVar5 = uVar5 + 1;
      piVar3 = piVar3 + 0x100;
      lVar4 = lVar4 + 0x100;
    } while (uVar5 != uVar7);
  }
  local_50 = this->list_of_bitwidths_of_miniblocks;
  local_60 = this->data;
  piVar3 = this->data + 1;
  uVar5 = 0;
  do {
    if (uVar5 < uVar7) {
      uVar11 = local_60[uVar5 * 0x100];
      lVar4 = 0;
      do {
        if (uVar11 < (ulong)piVar3[lVar4]) {
          uVar11 = piVar3[lVar4];
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xff);
      lVar4 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      bVar10 = '@' - ((byte)lVar4 ^ 0x3f);
      if (uVar11 >> 0x38 != 0) {
        bVar10 = '@';
      }
      if (uVar11 == 0) {
        bVar10 = '\0';
      }
    }
    else {
      bVar10 = '\0';
    }
    local_50[uVar5] = bVar10;
    uVar5 = uVar5 + 1;
    piVar3 = piVar3 + 0x100;
  } while (uVar5 != 8);
  uVar5 = this->min_delta >> 0x3f ^ this->min_delta * 2;
  local_58 = this;
  do {
    local_61 = (0x7f < uVar5) << 7 | (byte)uVar5 & 0x7f;
    (**writer->_vptr_WriteStream)(writer,&local_61,1);
    pbVar6 = local_50;
    bVar2 = 0x7f < uVar5;
    uVar5 = uVar5 >> 7;
  } while (bVar2);
  (**writer->_vptr_WriteStream)(writer,local_50,8);
  if (0xff < uVar12) {
    __s = local_58->data_packed;
    uVar12 = 0;
    piVar3 = local_60;
    local_48 = uVar7;
    local_40 = writer;
    do {
      switchD_010444a0::default(__s,0,0x800);
      bVar1 = pbVar6[uVar12];
      uVar5 = 0xffffffffffffffe0;
      uVar7 = 0;
      local_60 = piVar3;
      local_38 = uVar12;
      do {
        duckdb_fastpforlib::fastpack
                  ((uint64_t *)piVar3,(uint32_t *)(__s + (uVar7 >> 3)),(uint)bVar1);
        uVar12 = local_38;
        pbVar6 = local_50;
        uVar5 = uVar5 + 0x20;
        piVar3 = piVar3 + 0x20;
        uVar7 = uVar7 + (ulong)bVar1 * 0x20;
      } while (uVar5 < 0xe0);
      (**local_40->_vptr_WriteStream)(local_40,__s,(ulong)local_50[local_38] << 5);
      uVar12 = uVar12 + 1;
      piVar3 = local_60 + 0x100;
    } while (uVar12 != local_48);
  }
  local_58->count = local_58->count + local_58->block_count;
  local_58->min_delta = 0x7fffffffffffffff;
  local_58->block_count = 0;
  return;
}

Assistant:

void WriteBlock(WriteStream &writer) {
		D_ASSERT(count + block_count == total_value_count || block_count == BLOCK_SIZE_IN_VALUES);
		const auto number_of_miniblocks =
		    (block_count + NUMBER_OF_VALUES_IN_A_MINIBLOCK - 1) / NUMBER_OF_VALUES_IN_A_MINIBLOCK;
		for (idx_t miniblock_idx = 0; miniblock_idx < number_of_miniblocks; miniblock_idx++) {
			for (idx_t i = 0; i < NUMBER_OF_VALUES_IN_A_MINIBLOCK; i++) {
				const idx_t index = miniblock_idx * NUMBER_OF_VALUES_IN_A_MINIBLOCK + i;
				auto &value = data[index];
				if (index < block_count) {
					// 2. Compute the frame of reference (the minimum of the deltas in the block).
					// Subtract this min delta from all deltas in the block.
					// This guarantees that all values are non-negative.
					D_ASSERT(min_delta <= value);
					value = static_cast<int64_t>(static_cast<uint64_t>(value) - static_cast<uint64_t>(min_delta));
				} else {
					// If there are not enough values to fill the last miniblock, we pad the miniblock
					// so that its length is always the number of values in a full miniblock multiplied by the bit
					// width. The values of the padding bits should be zero, but readers must accept paddings consisting
					// of arbitrary bits as well.
					value = 0;
				}
			}
		}

		for (idx_t miniblock_idx = 0; miniblock_idx < NUMBER_OF_MINIBLOCKS_IN_A_BLOCK; miniblock_idx++) {
			auto &width = list_of_bitwidths_of_miniblocks[miniblock_idx];
			if (miniblock_idx < number_of_miniblocks) {
				const auto src = &data[miniblock_idx * NUMBER_OF_VALUES_IN_A_MINIBLOCK];
				width = BitpackingPrimitives::MinimumBitWidth(reinterpret_cast<uint64_t *>(src),
				                                              NUMBER_OF_VALUES_IN_A_MINIBLOCK);
				D_ASSERT(width <= sizeof(int64_t) * 8);
			} else {
				// If, in the last block, less than <number of miniblocks in a block> miniblocks are needed to store the
				// values, the bytes storing the bit widths of the unneeded miniblocks are still present, their value
				// should be zero, but readers must accept arbitrary values as well. There are no additional padding
				// bytes for the miniblock bodies though, as if their bit widths were 0 (regardless of the actual byte
				// values). The reader knows when to stop reading by keeping track of the number of values read.
				width = 0;
			}
		}

		// 3. Encode the frame of reference (min delta) as a zigzag ULEB128 int
		// followed by the bit widths of the miniblocks
		// and the delta values (minus the min delta) bit-packed per miniblock.
		// <min delta> <list of bitwidths of miniblocks> <miniblocks>

		// the min delta is a zigzag ULEB128 int (we compute a minimum as we need positive integers for bit packing)
		ParquetDecodeUtils::VarintEncode(ParquetDecodeUtils::IntToZigzag(min_delta), writer);
		// the bitwidth of each block is stored as a byte
		writer.WriteData(list_of_bitwidths_of_miniblocks, NUMBER_OF_MINIBLOCKS_IN_A_BLOCK);
		// each miniblock is a list of bit packed ints according to the bit width stored at the beginning of the block
		for (idx_t miniblock_idx = 0; miniblock_idx < number_of_miniblocks; miniblock_idx++) {
			const auto src = &data[miniblock_idx * NUMBER_OF_VALUES_IN_A_MINIBLOCK];
			const auto &width = list_of_bitwidths_of_miniblocks[miniblock_idx];
			memset(data_packed, 0, sizeof(data_packed));
			ParquetDecodeUtils::BitPackAligned(reinterpret_cast<uint64_t *>(src), data_packed,
			                                   NUMBER_OF_VALUES_IN_A_MINIBLOCK, width);
			const auto write_size = NUMBER_OF_VALUES_IN_A_MINIBLOCK * width / 8;
#ifdef DEBUG
			// immediately verify that unpacking yields the input data
			int64_t verification_data[NUMBER_OF_VALUES_IN_A_MINIBLOCK];
			ByteBuffer byte_buffer(data_ptr_cast(data_packed), write_size);
			bitpacking_width_t bitpack_pos = 0;
			ParquetDecodeUtils::BitUnpack(byte_buffer, bitpack_pos, verification_data, NUMBER_OF_VALUES_IN_A_MINIBLOCK,
			                              width);
			for (idx_t i = 0; i < NUMBER_OF_VALUES_IN_A_MINIBLOCK; i++) {
				D_ASSERT(src[i] == verification_data[i]);
			}
#endif
			writer.WriteData(data_packed, write_size);
		}

		count += block_count;

		min_delta = NumericLimits<int64_t>::Maximum();
		block_count = 0;
	}